

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int GmfSetHONodesOrdering(int64_t MshIdx,int KwdCod,int *BasTab,int *OrdTab)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  undefined8 *puVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  iVar5 = 0;
  if (KwdCod - 0xf1U < 0xffffff10) {
    return 0;
  }
  uVar11 = KwdCod & 0xff;
  lVar13 = 1;
  if (0x55 < uVar11) {
    switch(uVar11) {
    case 0x56:
      lVar13 = 4;
      uVar11 = 0x12;
      break;
    case 0x57:
      lVar13 = 3;
      uVar11 = 0xe;
      break;
    case 0x58:
      lVar13 = 2;
      uVar11 = 0x10;
      break;
    case 0x59:
      lVar13 = 2;
      uVar11 = 0x19;
      break;
    case 0x5a:
      lVar13 = 3;
LAB_0010a9b2:
      uVar11 = 10;
      break;
    case 0x5b:
      lVar13 = 3;
      uVar11 = 0xf;
      break;
    case 0x5c:
      goto switchD_0010a8dc_caseD_5c;
    case 0x5d:
switchD_0010a8dc_caseD_5d:
      uVar11 = 5;
      break;
    default:
      goto switchD_0010a8dc_caseD_5e;
    case 0x60:
      lVar13 = 4;
      uVar11 = 0x14;
      break;
    case 0x61:
      lVar13 = 4;
      uVar11 = 0x23;
      break;
    case 0x62:
      lVar13 = 3;
      uVar11 = 0x40;
      break;
    case 99:
      lVar13 = 3;
      uVar11 = 0x7d;
      break;
    case 100:
      lVar13 = 3;
      uVar11 = 0x1e;
      break;
    case 0x65:
      lVar13 = 3;
      uVar11 = 0x37;
      break;
    case 0x66:
      lVar13 = 4;
      uVar11 = 0x28;
      break;
    case 0x67:
      lVar13 = 4;
      uVar11 = 0x4b;
    }
    goto LAB_0010aa85;
  }
  switch(uVar11) {
  case 5:
    uVar11 = 2;
    break;
  case 6:
    lVar13 = 3;
switchD_0010a90d_caseD_19:
    uVar11 = 3;
    break;
  case 7:
    lVar13 = 2;
    goto switchD_0010a8dc_caseD_5c;
  case 8:
    lVar13 = 4;
switchD_0010a8dc_caseD_5c:
    uVar11 = 4;
    break;
  case 9:
    lVar13 = 4;
LAB_0010aa4d:
    uVar11 = 6;
    break;
  case 10:
    lVar13 = 3;
    uVar11 = 8;
    break;
  default:
    switch(uVar11) {
    case 0x18:
      lVar13 = 3;
      goto LAB_0010aa4d;
    case 0x19:
      goto switchD_0010a90d_caseD_19;
    case 0x1a:
    case 0x1c:
    case 0x1d:
    case 0x1f:
    case 0x20:
      goto switchD_0010a8dc_caseD_5e;
    case 0x1b:
      lVar13 = 2;
      uVar11 = 9;
      break;
    case 0x1e:
      lVar13 = 4;
      goto LAB_0010a9b2;
    case 0x21:
      lVar13 = 3;
      uVar11 = 0x1b;
      break;
    default:
      if (uVar11 != 0x31) {
        return 0;
      }
      lVar13 = 3;
      goto switchD_0010a8dc_caseD_5d;
    }
  }
LAB_0010aa85:
  puVar12 = (undefined8 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x10c8);
  pvVar2 = (void *)*puVar12;
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
  }
  pvVar2 = malloc((ulong)(uVar11 * 4));
  *puVar12 = pvVar2;
  if (pvVar2 != (void *)0x0) {
    uVar3 = (ulong)uVar11;
    uVar7 = (ulong)(uint)((int)lVar13 * 4);
    uVar6 = 0;
    do {
      uVar9 = 0;
      piVar8 = OrdTab;
      do {
        lVar10 = 0;
        do {
          if (BasTab[lVar10] != piVar8[lVar10]) goto LAB_0010aaf4;
          lVar10 = lVar10 + 1;
        } while (lVar13 != lVar10);
        *(int *)((long)pvVar2 + uVar9 * 4) = (int)uVar6;
LAB_0010aaf4:
        auVar1 = _DAT_0010c1d0;
        uVar9 = uVar9 + 1;
        piVar8 = (int *)((long)piVar8 + uVar7);
      } while (uVar9 != uVar3);
      uVar6 = uVar6 + 1;
      BasTab = (int *)((long)BasTab + uVar7);
    } while (uVar6 != uVar3);
    uVar4 = 0;
    iVar5 = 1;
    do {
      uVar7 = 0;
      while (*(uint *)((long)pvVar2 + uVar7 * 4) != uVar4) {
        uVar7 = uVar7 + 1;
        if (uVar3 == uVar7) {
          lVar13 = uVar3 - 1;
          auVar14._8_4_ = (int)lVar13;
          auVar14._0_8_ = lVar13;
          auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar3 = 0;
          auVar14 = auVar14 ^ _DAT_0010c1d0;
          auVar15 = ram0x0010c1c0;
          do {
            auVar16 = auVar15 ^ auVar1;
            if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                        auVar14._4_4_ < auVar16._4_4_) & 1)) {
              *(int *)((long)pvVar2 + uVar3 * 4) = (int)uVar3;
            }
            if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
                auVar16._12_4_ <= auVar14._12_4_) {
              *(int *)((long)pvVar2 + uVar3 * 4 + 4) = (int)uVar3 + 1;
            }
            uVar3 = uVar3 + 2;
            lVar13 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 2;
            auVar15._8_8_ = lVar13 + 2;
          } while ((uVar11 + 1 & 0xfffffffe) != uVar3);
          return 0;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar11);
  }
switchD_0010a8dc_caseD_5e:
  return iVar5;
}

Assistant:

int GmfSetHONodesOrdering(int64_t MshIdx, int KwdCod, int *BasTab, int *OrdTab)
{
   int i, j, k, flg, NmbNod, NmbCrd;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;
   
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   // Find the Bezier indices dimension according to the element's kind
   switch(KwdCod)
   {
      case GmfEdges   :          NmbNod =  2; NmbCrd = 1; break;
      case GmfEdgesP2 :          NmbNod =  3; NmbCrd = 1; break;
      case GmfEdgesP3 :          NmbNod =  4; NmbCrd = 1; break;
      case GmfEdgesP4 :          NmbNod =  5; NmbCrd = 1; break;
      case GmfTriangles   :      NmbNod =  3; NmbCrd = 3; break;
      case GmfTrianglesP2 :      NmbNod =  6; NmbCrd = 3; break;
      case GmfTrianglesP3 :      NmbNod = 10; NmbCrd = 3; break;
      case GmfTrianglesP4 :      NmbNod = 15; NmbCrd = 3; break;
      case GmfQuadrilaterals   : NmbNod =  4; NmbCrd = 2; break;
      case GmfQuadrilateralsQ2 : NmbNod =  9; NmbCrd = 2; break;
      case GmfQuadrilateralsQ3 : NmbNod = 16; NmbCrd = 2; break;
      case GmfQuadrilateralsQ4 : NmbNod = 25; NmbCrd = 2; break;
      case GmfTetrahedra   :     NmbNod =  4; NmbCrd = 4; break;
      case GmfTetrahedraP2 :     NmbNod = 10; NmbCrd = 4; break;
      case GmfTetrahedraP3 :     NmbNod = 20; NmbCrd = 4; break;
      case GmfTetrahedraP4 :     NmbNod = 35; NmbCrd = 4; break;
      case GmfPyramids   :       NmbNod =  5; NmbCrd = 3; break;
      case GmfPyramidsP2 :       NmbNod = 14; NmbCrd = 3; break;
      case GmfPyramidsP3 :       NmbNod = 30; NmbCrd = 3; break;
      case GmfPyramidsP4 :       NmbNod = 55; NmbCrd = 3; break;
      case GmfPrisms   :         NmbNod =  6; NmbCrd = 4; break;
      case GmfPrismsP2 :         NmbNod = 18; NmbCrd = 4; break;
      case GmfPrismsP3 :         NmbNod = 40; NmbCrd = 4; break;
      case GmfPrismsP4 :         NmbNod = 75; NmbCrd = 4; break;
      case GmfHexahedra   :      NmbNod =  8; NmbCrd = 3; break;
      case GmfHexahedraQ2 :      NmbNod = 27; NmbCrd = 3; break;
      case GmfHexahedraQ3 :      NmbNod = 64; NmbCrd = 3; break;
      case GmfHexahedraQ4 :      NmbNod =125; NmbCrd = 3; break;
      default : return(0);
   }

   // Free and rebuild the mapping table if there were already one
   if(kwd->OrdTab)
      free(kwd->OrdTab);

   if(!(kwd->OrdTab = malloc(NmbNod * sizeof(int))))
      return(0);

   // Find the corresponding Bezier coordinates from the source table
   for(i=0;i<NmbNod;i++)
   {
      for(j=0;j<NmbNod;j++)
      {
         flg = 1;

         for(k=0;k<NmbCrd;k++)
            if(BasTab[ i * NmbCrd + k ] != OrdTab[ j * NmbCrd + k ])
            {
               flg = 0;
               break;
            }

         if(flg)
            kwd->OrdTab[j] = i;
      }
   }

   // Check the ordering consistency
   for(i=0;i<NmbNod;i++)
   {
      flg = 0;

      for(j=0;j<NmbNod;j++)
         if(kwd->OrdTab[j] == i)
         {
            flg = 1;
            break;
         }

      if(!flg)
      {
         for(j=0;j<NmbNod;j++)
            kwd->OrdTab[j] = j;

         return(0);
      }
   }

   return(1);
}